

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::detail::TokenStream::loadBuffer(TokenStream *this)

{
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *this_00;
  char *pcVar1;
  pointer pcVar2;
  size_type __n;
  _Alloc_hider _Var3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string opt;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &this->m_tokenBuffer;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::resize
            (this_00,0);
  this_01 = (this->it)._M_current;
  while( true ) {
    if (this_01 == (this->itEnd)._M_current) {
      return;
    }
    if (this_01->_M_string_length != 0) break;
    this_01 = this_01 + 1;
    (this->it)._M_current = this_01;
  }
  pcVar1 = (this_01->_M_dataplus)._M_p;
  if (*pcVar1 == '-') {
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(this_01," :=",0,3);
    if (__n != 0xffffffffffffffff) {
      local_78._0_4_ = Option;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 8)
                 ,this_01,0,__n);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
      if (local_70._M_dataplus._M_p != local_78 + 0x18) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_78._0_4_ = Argument;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 8)
                 ,this_01,__n + 1,0xffffffffffffffff);
      std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
      emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
      local_40._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
      _Var3._M_p = local_70._M_dataplus._M_p;
      if (local_70._M_dataplus._M_p == local_78 + 0x18) {
        return;
      }
      goto LAB_0013c38f;
    }
    pcVar2 = (this_01->_M_dataplus)._M_p;
    if (2 < this_01->_M_string_length && pcVar2[1] != '-') {
      local_50 = &local_40;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"- ","");
      if (1 < this_01->_M_string_length) {
        uVar4 = 1;
        do {
          local_50->_M_local_buf[1] = (this_01->_M_dataplus)._M_p[uVar4];
          local_78._0_4_ = Option;
          local_70._M_dataplus._M_p = (pointer)(local_78 + 0x18);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_78 + 8),local_50,local_50->_M_local_buf + local_48);
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_78 + 0x18)) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < this_01->_M_string_length);
      }
      _Var3._M_p = (pointer)local_50;
      if (local_50 == &local_40) {
        return;
      }
      goto LAB_0013c38f;
    }
    local_78._0_4_ = Option;
    local_70._M_dataplus._M_p = local_78 + 0x18;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_78 + 8),pcVar2,pcVar2 + this_01->_M_string_length);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
    emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
  }
  else {
    local_78._0_4_ = Argument;
    local_70._M_dataplus._M_p = local_78 + 0x18;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_78 + 8),pcVar1,pcVar1 + this_01->_M_string_length);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
    emplace_back<Catch::clara::detail::Token>(this_00,(Token *)local_78);
  }
  local_40._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
  _Var3._M_p = local_70._M_dataplus._M_p;
  if (local_70._M_dataplus._M_p == local_78 + 0x18) {
    return;
  }
LAB_0013c38f:
  operator_delete(_Var3._M_p,local_40._M_allocated_capacity + 1);
  return;
}

Assistant:

void loadBuffer() {
            m_tokenBuffer.resize( 0 );

            // Skip any empty strings
            while( it != itEnd && it->empty() )
                ++it;

            if( it != itEnd ) {
                auto const &next = *it;
                if( isOptPrefix( next[0] ) ) {
                    auto delimiterPos = next.find_first_of( " :=" );
                    if( delimiterPos != std::string::npos ) {
                        m_tokenBuffer.push_back( { TokenType::Option, next.substr( 0, delimiterPos ) } );
                        m_tokenBuffer.push_back( { TokenType::Argument, next.substr( delimiterPos + 1 ) } );
                    } else {
                        if( next[1] != '-' && next.size() > 2 ) {
                            std::string opt = "- ";
                            for( size_t i = 1; i < next.size(); ++i ) {
                                opt[1] = next[i];
                                m_tokenBuffer.push_back( { TokenType::Option, opt } );
                            }
                        } else {
                            m_tokenBuffer.push_back( { TokenType::Option, next } );
                        }
                    }
                } else {
                    m_tokenBuffer.push_back( { TokenType::Argument, next } );
                }
            }
        }